

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_266c4a5::SSETest::RunTest
          (SSETest *this,bool is_random,int width,int height,int run_times)

{
  uchar *puVar1;
  undefined8 *puVar2;
  undefined2 uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t *puVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uchar *puVar11;
  undefined7 in_register_00000031;
  char *pcVar12;
  uint8_t *puVar13;
  SEARCH_METHODS *message;
  ulong uVar14;
  ACMRandom *pAVar15;
  int iVar16;
  bool bVar17;
  int64_t res_ref;
  int64_t res_tst;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  int local_c8;
  int local_c4;
  ulong local_c0;
  ACMRandom *local_b8;
  undefined4 local_b0;
  int local_ac;
  long local_a8;
  internal local_a0 [8];
  undefined8 *local_98;
  long local_90;
  ulong local_88;
  AssertHelper local_80;
  long local_78;
  timeval local_70;
  timeval local_60;
  timeval local_50;
  timeval local_40;
  
  local_b0 = (undefined4)CONCAT71(in_register_00000031,is_random);
  local_b8 = &this->rnd_;
  local_d0 = (ulong)(uint)height;
  local_d8 = (ulong)(uint)width;
  local_e4 = 0;
  iVar16 = 0;
  pAVar15 = local_b8;
  local_dc = width;
  local_c8 = run_times;
  local_ac = height;
  do {
    do {
      uVar4 = testing::internal::Random::Generate(&pAVar15->random_,7);
      iVar9 = 4 << ((byte)uVar4 & 0x1f);
    } while (iVar9 < width);
    local_e0 = iVar9;
    local_c4 = iVar16;
    if ((char)local_b0 == '\0') {
      uVar3 = 0xff;
      if (this->is_hbd_ != false) {
        uVar3 = 0xfff;
      }
      puVar7 = this->src_;
      if (iVar16 == 0) {
        if (0 < height) {
          lVar8 = (long)iVar9;
          uVar5 = 0;
          puVar13 = puVar7;
          do {
            if (0 < width) {
              uVar10 = 0;
              do {
                if (this->is_hbd_ == false) {
                  puVar7[uVar10] = '\0';
                }
                else {
                  (puVar13 + uVar10 * 2)[0] = '\0';
                  (puVar13 + uVar10 * 2)[1] = '\0';
                }
                uVar10 = uVar10 + 1;
              } while (local_d8 != uVar10);
            }
            uVar5 = uVar5 + 1;
            puVar13 = puVar13 + lVar8 * 2;
            puVar7 = puVar7 + lVar8;
          } while (uVar5 != local_d0);
          puVar7 = this->ref_;
          uVar5 = 0;
          puVar13 = puVar7;
          do {
            if (0 < width) {
              uVar10 = 0;
              do {
                if (this->is_hbd_ == false) {
                  puVar7[uVar10] = 0xff;
                }
                else {
                  *(undefined2 *)(puVar13 + uVar10 * 2) = uVar3;
                }
                uVar10 = uVar10 + 1;
              } while (local_d8 != uVar10);
            }
            uVar5 = uVar5 + 1;
            puVar13 = puVar13 + lVar8 * 2;
            puVar7 = puVar7 + lVar8;
          } while (uVar5 != local_d0);
        }
      }
      else if (0 < height) {
        lVar8 = (long)iVar9;
        uVar5 = 0;
        puVar13 = puVar7;
        do {
          if (0 < width) {
            uVar10 = 0;
            do {
              if (this->is_hbd_ == false) {
                puVar7[uVar10] = 0xff;
              }
              else {
                *(undefined2 *)(puVar13 + uVar10 * 2) = uVar3;
              }
              uVar10 = uVar10 + 1;
            } while (local_d8 != uVar10);
          }
          uVar5 = uVar5 + 1;
          puVar13 = puVar13 + lVar8 * 2;
          puVar7 = puVar7 + lVar8;
        } while (uVar5 != local_d0);
        puVar7 = this->ref_;
        uVar5 = 0;
        puVar13 = puVar7;
        do {
          if (0 < width) {
            uVar10 = 0;
            do {
              if (this->is_hbd_ == false) {
                puVar7[uVar10] = '\0';
              }
              else {
                (puVar13 + uVar10 * 2)[0] = '\0';
                (puVar13 + uVar10 * 2)[1] = '\0';
              }
              uVar10 = uVar10 + 1;
            } while (local_d8 != uVar10);
          }
          uVar5 = uVar5 + 1;
          puVar13 = puVar13 + lVar8 * 2;
          puVar7 = puVar7 + lVar8;
        } while (uVar5 != local_d0);
      }
    }
    else if (0 < height) {
      puVar7 = this->src_;
      puVar13 = this->ref_;
      local_90 = (long)iVar9;
      uVar10 = 0;
      uVar5 = 0;
      do {
        uVar14 = local_d8;
        local_c0 = uVar10;
        local_88 = uVar5;
        if (0 < width) {
          do {
            pAVar15 = local_b8;
            if (this->is_hbd_ == false) {
              uVar4 = testing::internal::Random::Generate(&local_b8->random_,0x80000000);
              this->src_[uVar10] = (uint8_t)(uVar4 >> 0x17);
              uVar4 = testing::internal::Random::Generate(&pAVar15->random_,0x80000000);
              this->ref_[uVar10] = (uint8_t)(uVar4 >> 0x17);
            }
            else {
              uVar4 = testing::internal::Random::Generate(&local_b8->random_,0x1000);
              *(short *)(puVar7 + uVar10 * 2) = (short)uVar4;
              uVar4 = testing::internal::Random::Generate(&pAVar15->random_,0x1000);
              *(short *)(puVar13 + uVar10 * 2) = (short)uVar4;
            }
            uVar10 = uVar10 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar5 = local_88 + 1;
        uVar10 = local_c0 + local_90;
        height = local_ac;
        width = local_dc;
      } while (uVar5 != local_d0);
    }
    iVar16 = local_e0;
    puVar11 = (uchar *)((ulong)this->ref_ >> 1);
    puVar1 = (uchar *)((ulong)this->src_ >> 1);
    if (this->is_hbd_ == false) {
      puVar11 = this->ref_;
      puVar1 = this->src_;
    }
    local_a8 = (*(this->params_).ref_func)(puVar1,local_e0,puVar11,local_e0,width,height);
    local_78 = (*(this->params_).tst_func)(puVar1,iVar16,puVar11,iVar16,width,height);
    iVar16 = local_c4;
    iVar9 = local_c8;
    if (local_c8 < 2) {
      bVar17 = local_e4 == 0;
      local_e4 = 1;
      if (bVar17) {
        local_e4 = 0;
        bVar17 = local_a8 != local_78;
        testing::internal::CmpHelperEQ<long,long>(local_a0,"res_ref","res_tst",&local_a8,&local_78);
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10),"Error:",6);
          pcVar12 = " ";
          if ((ulong)this->is_hbd_ != 0) {
            pcVar12 = "hbd ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10),pcVar12,(ulong)this->is_hbd_ * 3 + 1)
          ;
          std::ostream::operator<<(local_f0._M_head_impl + 0x10,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10)," SSE Test [",0xb);
          std::ostream::operator<<(local_f0._M_head_impl + 0x10,width);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10),"x",1);
          std::ostream::operator<<(local_f0._M_head_impl + 0x10,height);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10),
                     "] C output does not match optimized output.",0x2b);
          message = "";
          if (local_98 != (undefined8 *)0x0) {
            message = (SEARCH_METHODS *)*local_98;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sum_squares_test.cc"
                     ,0x188,(char *)message);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_f0);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_f0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_f0._M_head_impl + 8))();
          }
        }
        puVar2 = local_98;
        if (local_98 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_98 != local_98 + 2) {
            operator_delete((undefined8 *)*local_98);
          }
          operator_delete(puVar2);
        }
        local_e4 = CONCAT31((int3)((uint)local_e4 >> 8),bVar17);
        width = local_dc;
      }
    }
    else {
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
      iVar16 = local_e0;
      do {
        (*(this->params_).ref_func)(puVar1,iVar16,puVar11,iVar16,local_dc,height);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      lVar8 = local_40.tv_usec - local_50.tv_usec;
      iVar9 = (int)lVar8 + 1000000;
      if (-1 < lVar8) {
        iVar9 = (int)lVar8;
      }
      local_c0 = CONCAT44(local_c0._4_4_,
                          iVar9 + ((int)(lVar8 >> 0x3f) +
                                  ((int)local_40.tv_sec - (int)local_50.tv_sec)) * 1000000);
      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
      iVar9 = local_c8;
      do {
        (*(this->params_).tst_func)(puVar1,iVar16,puVar11,iVar16,local_dc,height);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      lVar8 = local_60.tv_usec - local_70.tv_usec;
      iVar16 = (int)lVar8 + 1000000;
      if (-1 < lVar8) {
        iVar16 = (int)lVar8;
      }
      uVar6 = iVar16 + ((int)(lVar8 >> 0x3f) + ((int)local_60.tv_sec - (int)local_70.tv_sec)) *
                       1000000;
      printf("c_time=%d \t simd_time=%d \t gain=%d\n",local_c0 & 0xffffffff,(ulong)uVar6,
             (long)(int)local_c0 / (long)(int)uVar6 & 0xffffffff);
      width = local_dc;
      iVar16 = local_c4;
    }
    iVar16 = iVar16 + 1;
    pAVar15 = local_b8;
  } while (iVar16 != 3);
  return;
}

Assistant:

void SSETest::RunTest(bool is_random, int width, int height, int run_times) {
  int failed = 0;
  aom_usec_timer ref_timer, test_timer;
  for (int k = 0; k < 3; k++) {
    int stride = 4 << rnd_(7);  // Up to 256 stride
    while (stride < width) {    // Make sure it's valid
      stride = 4 << rnd_(7);
    }
    if (is_random) {
      GenRandomData(width, height, stride);
    } else {
      const int msb = is_hbd_ ? 12 : 8;  // Up to 12 bit input
      const int limit = (1 << msb) - 1;
      if (k == 0) {
        GenExtremeData(width, height, stride, src_, 0);
        GenExtremeData(width, height, stride, ref_, limit);
      } else {
        GenExtremeData(width, height, stride, src_, limit);
        GenExtremeData(width, height, stride, ref_, 0);
      }
    }
    int64_t res_ref, res_tst;
    uint8_t *src = src_;
    uint8_t *ref = ref_;
    if (is_hbd_) {
      src = CONVERT_TO_BYTEPTR(src_);
      ref = CONVERT_TO_BYTEPTR(ref_);
    }
    res_ref = params_.ref_func(src, stride, ref, stride, width, height);
    res_tst = params_.tst_func(src, stride, ref, stride, width, height);
    if (run_times > 1) {
      aom_usec_timer_start(&ref_timer);
      for (int j = 0; j < run_times; j++) {
        params_.ref_func(src, stride, ref, stride, width, height);
      }
      aom_usec_timer_mark(&ref_timer);
      const int elapsed_time_c =
          static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

      aom_usec_timer_start(&test_timer);
      for (int j = 0; j < run_times; j++) {
        params_.tst_func(src, stride, ref, stride, width, height);
      }
      aom_usec_timer_mark(&test_timer);
      const int elapsed_time_simd =
          static_cast<int>(aom_usec_timer_elapsed(&test_timer));

      printf(
          "c_time=%d \t simd_time=%d \t "
          "gain=%d\n",
          elapsed_time_c, elapsed_time_simd,
          (elapsed_time_c / elapsed_time_simd));
    } else {
      if (!failed) {
        failed = res_ref != res_tst;
        EXPECT_EQ(res_ref, res_tst)
            << "Error:" << (is_hbd_ ? "hbd " : " ") << k << " SSE Test ["
            << width << "x" << height
            << "] C output does not match optimized output.";
      }
    }
  }
}